

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O1

DatatypeValidator * __thiscall
xercesc_4_0::DatatypeValidatorFactory::createDatatypeValidator
          (DatatypeValidatorFactory *this,XMLCh *typeName,DatatypeValidator *baseValidator,
          RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets,
          RefArrayVectorOf<char16_t> *enums,bool isDerivedByList,int finalSet,bool isUserDefined,
          MemoryManager *userManager)

{
  short *psVar1;
  short *psVar2;
  ushort uVar3;
  ValidatorType VVar4;
  RefHashTableBucketElem<xercesc_4_0::KVStringPair> **ppRVar5;
  undefined2 *puVar6;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *this_00;
  XMLSize_t XVar7;
  int iVar8;
  ListDatatypeValidator *this_01;
  ulong uVar9;
  ulong uVar10;
  RefHashTableBucketElem<xercesc_4_0::KVStringPair> *pRVar11;
  undefined4 extraout_var;
  KVStringPair *pKVar12;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *pRVar13;
  undefined4 extraout_var_00;
  XMLSize_t XVar14;
  long lVar15;
  bool bVar16;
  ushort *puVar17;
  short sVar18;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> **ppRVar19;
  MemoryManager *manager;
  
  if (baseValidator == (DatatypeValidator *)0x0) {
    if (facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
      RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::~RefHashTableOf(facets);
      XMemory::operator_delete((XMemory *)facets,typeName);
    }
    if (enums != (RefArrayVectorOf<char16_t> *)0x0) {
      (*(enums->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[1])(enums);
    }
    return (DatatypeValidator *)0x0;
  }
  manager = userManager;
  if (!isUserDefined) {
    manager = XMLPlatformUtils::fgMemoryManager;
  }
  if (isDerivedByList) {
    this_01 = (ListDatatypeValidator *)XMemory::operator_new(0x98,manager);
    ListDatatypeValidator::ListDatatypeValidator
              (this_01,baseValidator,facets,enums,finalSet,manager);
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fOrdered = ORDERED_FALSE;
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fNumeric = false;
    if (facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
      uVar10 = facets->fHashModulus;
      uVar9 = 0x6c;
      uVar3 = 0x65;
      puVar17 = &DAT_0037203c;
      do {
        uVar9 = (ulong)uVar3 + (uVar9 >> 0x18) + uVar9 * 0x26;
        uVar3 = *puVar17;
        puVar17 = puVar17 + 1;
      } while (uVar3 != 0);
      ppRVar5 = facets->fBucketList;
      for (pRVar11 = ppRVar5[uVar9 % uVar10];
          pRVar11 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
          pRVar11 = pRVar11->fNext) {
        puVar6 = (undefined2 *)pRVar11->fKey;
        if (puVar6 == &SchemaSymbols::fgELT_LENGTH) goto LAB_002fe21e;
        sVar18 = 0x6c;
        if (puVar6 == (undefined2 *)0x0) {
LAB_002fe210:
          if (sVar18 == 0) goto LAB_002fe21e;
        }
        else {
          lVar15 = 0;
          do {
            psVar1 = (short *)((long)&SchemaSymbols::fgELT_LENGTH + lVar15);
            if (*psVar1 == 0) {
              sVar18 = *(short *)((long)puVar6 + lVar15);
              goto LAB_002fe210;
            }
            psVar2 = (short *)((long)puVar6 + lVar15);
            lVar15 = lVar15 + 2;
          } while (*psVar1 == *psVar2);
        }
      }
      pRVar11 = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
LAB_002fe21e:
      if ((pRVar11 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) &&
         (pRVar11->fData != (KVStringPair *)0x0)) {
LAB_002fe229:
        (this_01->super_AbstractStringValidator).super_DatatypeValidator.fFinite = true;
        (this_01->super_AbstractStringValidator).super_DatatypeValidator.fBounded = true;
        goto LAB_002fe8fa;
      }
      uVar9 = 0x6d;
      uVar3 = 0x69;
      puVar17 = &DAT_003720f4;
      do {
        uVar9 = (ulong)uVar3 + (uVar9 >> 0x18) + uVar9 * 0x26;
        uVar3 = *puVar17;
        puVar17 = puVar17 + 1;
      } while (uVar3 != 0);
      for (pRVar11 = ppRVar5[uVar9 % uVar10];
          pRVar11 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
          pRVar11 = pRVar11->fNext) {
        puVar6 = (undefined2 *)pRVar11->fKey;
        if (puVar6 == &SchemaSymbols::fgELT_MINLENGTH) goto LAB_002fe5f3;
        sVar18 = 0x6d;
        if (puVar6 == (undefined2 *)0x0) {
LAB_002fe5e5:
          if (sVar18 == 0) goto LAB_002fe5f3;
        }
        else {
          lVar15 = 0;
          do {
            psVar1 = (short *)((long)&SchemaSymbols::fgELT_MINLENGTH + lVar15);
            if (*psVar1 == 0) {
              sVar18 = *(short *)((long)puVar6 + lVar15);
              goto LAB_002fe5e5;
            }
            psVar2 = (short *)((long)puVar6 + lVar15);
            lVar15 = lVar15 + 2;
          } while (*psVar1 == *psVar2);
        }
      }
      pRVar11 = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
LAB_002fe5f3:
      if ((pRVar11 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) &&
         (pRVar11->fData != (KVStringPair *)0x0)) {
        uVar9 = 0x6d;
        uVar3 = 0x61;
        puVar17 = &DAT_00372094;
        do {
          uVar9 = (ulong)uVar3 + (uVar9 >> 0x18) + uVar9 * 0x26;
          uVar3 = *puVar17;
          puVar17 = puVar17 + 1;
        } while (uVar3 != 0);
        for (pRVar11 = ppRVar5[uVar9 % uVar10];
            pRVar11 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
            pRVar11 = pRVar11->fNext) {
          puVar6 = (undefined2 *)pRVar11->fKey;
          if (puVar6 == &SchemaSymbols::fgELT_MAXLENGTH) goto LAB_002fe8e3;
          sVar18 = 0x6d;
          if (puVar6 == (undefined2 *)0x0) {
LAB_002fe8d6:
            if (sVar18 == 0) goto LAB_002fe8e3;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgELT_MAXLENGTH + lVar15);
              if (*psVar1 == 0) {
                sVar18 = *(short *)((long)puVar6 + lVar15);
                goto LAB_002fe8d6;
              }
              psVar2 = (short *)((long)puVar6 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
        }
        pRVar11 = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
LAB_002fe8e3:
        if ((pRVar11 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) &&
           (pRVar11->fData != (KVStringPair *)0x0)) goto LAB_002fe229;
      }
    }
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fFinite = false;
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fBounded = false;
    goto LAB_002fe8fa;
  }
  if ((facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) &&
     (baseValidator->fType != String)) {
    uVar10 = 0x77;
    uVar3 = 0x68;
    puVar17 = &DAT_00371fd4;
    do {
      uVar10 = (ulong)uVar3 + (uVar10 >> 0x18) + uVar10 * 0x26;
      uVar3 = *puVar17;
      puVar17 = puVar17 + 1;
    } while (uVar3 != 0);
    for (pRVar11 = facets->fBucketList[uVar10 % facets->fHashModulus];
        pRVar11 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
        pRVar11 = pRVar11->fNext) {
      puVar6 = (undefined2 *)pRVar11->fKey;
      if (puVar6 == &SchemaSymbols::fgELT_WHITESPACE) goto LAB_002fe2d5;
      sVar18 = 0x77;
      if (puVar6 == (undefined2 *)0x0) {
LAB_002fe2c8:
        if (sVar18 == 0) goto LAB_002fe2d5;
      }
      else {
        lVar15 = 0;
        do {
          psVar1 = (short *)((long)&SchemaSymbols::fgELT_WHITESPACE + lVar15);
          if (*psVar1 == 0) {
            sVar18 = *(short *)((long)puVar6 + lVar15);
            goto LAB_002fe2c8;
          }
          psVar2 = (short *)((long)puVar6 + lVar15);
          lVar15 = lVar15 + 2;
        } while (*psVar1 == *psVar2);
      }
    }
    pRVar11 = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
LAB_002fe2d5:
    if ((pRVar11 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) &&
       (pRVar11->fData != (KVStringPair *)0x0)) {
      RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::removeKey
                (facets,&SchemaSymbols::fgELT_WHITESPACE);
    }
  }
  iVar8 = (*(baseValidator->super_XSerializable)._vptr_XSerializable[0xb])
                    (baseValidator,facets,enums,(ulong)(uint)finalSet,manager);
  this_01 = (ListDatatypeValidator *)CONCAT44(extraout_var,iVar8);
  (this_01->super_AbstractStringValidator).super_DatatypeValidator.fOrdered =
       baseValidator->fOrdered;
  (this_01->super_AbstractStringValidator).super_DatatypeValidator.fNumeric =
       baseValidator->fNumeric;
  if (facets == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0)
  goto LAB_002fe6db;
  this_00 = baseValidator->fFacets;
  uVar10 = 0x6d;
  uVar3 = 0x69;
  puVar17 = &DAT_003720d4;
  do {
    uVar10 = (ulong)uVar3 + (uVar10 >> 0x18) + uVar10 * 0x26;
    uVar3 = *puVar17;
    puVar17 = puVar17 + 1;
  } while (uVar3 != 0);
  for (pRVar11 = facets->fBucketList[uVar10 % facets->fHashModulus];
      pRVar11 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0; pRVar11 = pRVar11->fNext)
  {
    puVar6 = (undefined2 *)pRVar11->fKey;
    if (puVar6 == &SchemaSymbols::fgELT_MININCLUSIVE) goto LAB_002fe3c3;
    sVar18 = 0x6d;
    if (puVar6 == (undefined2 *)0x0) {
LAB_002fe3b5:
      if (sVar18 == 0) goto LAB_002fe3c3;
    }
    else {
      lVar15 = 0;
      do {
        psVar1 = (short *)((long)&SchemaSymbols::fgELT_MININCLUSIVE + lVar15);
        if (*psVar1 == 0) {
          sVar18 = *(short *)((long)puVar6 + lVar15);
          goto LAB_002fe3b5;
        }
        psVar2 = (short *)((long)puVar6 + lVar15);
        lVar15 = lVar15 + 2;
      } while (*psVar1 == *psVar2);
    }
  }
  pRVar11 = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
LAB_002fe3c3:
  if ((pRVar11 == (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) ||
     (pRVar11->fData == (KVStringPair *)0x0)) {
    uVar10 = 0x6d;
    uVar3 = 0x69;
    puVar17 = &DAT_003720b4;
    do {
      uVar10 = (ulong)uVar3 + (uVar10 >> 0x18) + uVar10 * 0x26;
      uVar3 = *puVar17;
      puVar17 = puVar17 + 1;
    } while (uVar3 != 0);
    for (pRVar11 = facets->fBucketList[uVar10 % facets->fHashModulus];
        pRVar11 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
        pRVar11 = pRVar11->fNext) {
      puVar6 = (undefined2 *)pRVar11->fKey;
      if (puVar6 == &SchemaSymbols::fgELT_MINEXCLUSIVE) goto LAB_002fe464;
      sVar18 = 0x6d;
      if (puVar6 == (undefined2 *)0x0) {
LAB_002fe457:
        if (sVar18 == 0) goto LAB_002fe464;
      }
      else {
        lVar15 = 0;
        do {
          psVar1 = (short *)((long)&SchemaSymbols::fgELT_MINEXCLUSIVE + lVar15);
          if (*psVar1 == 0) {
            sVar18 = *(short *)((long)puVar6 + lVar15);
            goto LAB_002fe457;
          }
          psVar2 = (short *)((long)puVar6 + lVar15);
          lVar15 = lVar15 + 2;
        } while (*psVar1 == *psVar2);
      }
    }
    pRVar11 = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
LAB_002fe464:
    if (((pRVar11 == (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) ||
        (pRVar11->fData == (KVStringPair *)0x0)) &&
       ((this_00 == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0 ||
        ((pKVar12 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                              (this_00,&SchemaSymbols::fgELT_MININCLUSIVE),
         pKVar12 == (KVStringPair *)0x0 &&
         (pKVar12 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                              (this_00,&SchemaSymbols::fgELT_MINEXCLUSIVE),
         pKVar12 == (KVStringPair *)0x0)))))) goto LAB_002fe6db;
  }
  uVar10 = 0x6d;
  uVar3 = 0x61;
  puVar17 = &DAT_00372074;
  do {
    uVar10 = (ulong)uVar3 + (uVar10 >> 0x18) + uVar10 * 0x26;
    uVar3 = *puVar17;
    puVar17 = puVar17 + 1;
  } while (uVar3 != 0);
  for (pRVar11 = facets->fBucketList[uVar10 % facets->fHashModulus];
      pRVar11 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0; pRVar11 = pRVar11->fNext)
  {
    puVar6 = (undefined2 *)pRVar11->fKey;
    if (puVar6 == &SchemaSymbols::fgELT_MAXINCLUSIVE) goto LAB_002fe543;
    sVar18 = 0x6d;
    if (puVar6 == (undefined2 *)0x0) {
LAB_002fe535:
      if (sVar18 == 0) goto LAB_002fe543;
    }
    else {
      lVar15 = 0;
      do {
        psVar1 = (short *)((long)&SchemaSymbols::fgELT_MAXINCLUSIVE + lVar15);
        if (*psVar1 == 0) {
          sVar18 = *(short *)((long)puVar6 + lVar15);
          goto LAB_002fe535;
        }
        psVar2 = (short *)((long)puVar6 + lVar15);
        lVar15 = lVar15 + 2;
      } while (*psVar1 == *psVar2);
    }
  }
  pRVar11 = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
LAB_002fe543:
  if ((pRVar11 == (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) ||
     (bVar16 = true, pRVar11->fData == (KVStringPair *)0x0)) {
    uVar10 = 0x6d;
    uVar3 = 0x61;
    puVar17 = &DAT_00372054;
    do {
      uVar10 = (ulong)uVar3 + (uVar10 >> 0x18) + uVar10 * 0x26;
      uVar3 = *puVar17;
      puVar17 = puVar17 + 1;
    } while (uVar3 != 0);
    for (pRVar11 = facets->fBucketList[uVar10 % facets->fHashModulus];
        pRVar11 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
        pRVar11 = pRVar11->fNext) {
      puVar6 = (undefined2 *)pRVar11->fKey;
      if (puVar6 == &SchemaSymbols::fgELT_MAXEXCLUSIVE) goto LAB_002fe69f;
      sVar18 = 0x6d;
      if (puVar6 == (undefined2 *)0x0) {
LAB_002fe692:
        if (sVar18 == 0) goto LAB_002fe69f;
      }
      else {
        lVar15 = 0;
        do {
          psVar1 = (short *)((long)&SchemaSymbols::fgELT_MAXEXCLUSIVE + lVar15);
          if (*psVar1 == 0) {
            sVar18 = *(short *)((long)puVar6 + lVar15);
            goto LAB_002fe692;
          }
          psVar2 = (short *)((long)puVar6 + lVar15);
          lVar15 = lVar15 + 2;
        } while (*psVar1 == *psVar2);
      }
    }
    pRVar11 = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
LAB_002fe69f:
    if ((pRVar11 == (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) ||
       (bVar16 = true, pRVar11->fData == (KVStringPair *)0x0)) {
      if (this_00 != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
        pKVar12 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                            (this_00,&SchemaSymbols::fgELT_MAXINCLUSIVE);
        bVar16 = true;
        if ((pKVar12 != (KVStringPair *)0x0) ||
           (pKVar12 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                                (this_00,&SchemaSymbols::fgELT_MAXEXCLUSIVE),
           pKVar12 != (KVStringPair *)0x0)) goto LAB_002fe6dd;
      }
LAB_002fe6db:
      bVar16 = false;
    }
  }
LAB_002fe6dd:
  (this_01->super_AbstractStringValidator).super_DatatypeValidator.fBounded = bVar16;
  if (baseValidator->fFinite != true) {
    if (facets == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
LAB_002fe894:
      (this_01->super_AbstractStringValidator).super_DatatypeValidator.fFinite = false;
      goto LAB_002fe8fa;
    }
    uVar10 = 0x6c;
    uVar3 = 0x65;
    puVar17 = &DAT_0037203c;
    do {
      uVar10 = (ulong)uVar3 + (uVar10 >> 0x18) + uVar10 * 0x26;
      uVar3 = *puVar17;
      puVar17 = puVar17 + 1;
    } while (uVar3 != 0);
    for (pRVar11 = facets->fBucketList[uVar10 % facets->fHashModulus];
        pRVar11 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
        pRVar11 = pRVar11->fNext) {
      puVar6 = (undefined2 *)pRVar11->fKey;
      if (puVar6 == &SchemaSymbols::fgELT_LENGTH) goto LAB_002fe79b;
      sVar18 = 0x6c;
      if (puVar6 == (undefined2 *)0x0) {
LAB_002fe78d:
        if (sVar18 == 0) goto LAB_002fe79b;
      }
      else {
        lVar15 = 0;
        do {
          psVar1 = (short *)((long)&SchemaSymbols::fgELT_LENGTH + lVar15);
          if (*psVar1 == 0) {
            sVar18 = *(short *)((long)puVar6 + lVar15);
            goto LAB_002fe78d;
          }
          psVar2 = (short *)((long)puVar6 + lVar15);
          lVar15 = lVar15 + 2;
        } while (*psVar1 == *psVar2);
      }
    }
    pRVar11 = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
LAB_002fe79b:
    if ((pRVar11 == (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) ||
       (pRVar11->fData == (KVStringPair *)0x0)) {
      uVar10 = 0x6d;
      uVar3 = 0x61;
      puVar17 = &DAT_00372094;
      do {
        uVar10 = (ulong)uVar3 + (uVar10 >> 0x18) + uVar10 * 0x26;
        uVar3 = *puVar17;
        puVar17 = puVar17 + 1;
      } while (uVar3 != 0);
      for (pRVar11 = facets->fBucketList[uVar10 % facets->fHashModulus];
          pRVar11 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
          pRVar11 = pRVar11->fNext) {
        puVar6 = (undefined2 *)pRVar11->fKey;
        if (puVar6 == &SchemaSymbols::fgELT_MAXLENGTH) goto LAB_002fe83c;
        sVar18 = 0x6d;
        if (puVar6 == (undefined2 *)0x0) {
LAB_002fe82f:
          if (sVar18 == 0) goto LAB_002fe83c;
        }
        else {
          lVar15 = 0;
          do {
            psVar1 = (short *)((long)&SchemaSymbols::fgELT_MAXLENGTH + lVar15);
            if (*psVar1 == 0) {
              sVar18 = *(short *)((long)puVar6 + lVar15);
              goto LAB_002fe82f;
            }
            psVar2 = (short *)((long)puVar6 + lVar15);
            lVar15 = lVar15 + 2;
          } while (*psVar1 == *psVar2);
        }
      }
      pRVar11 = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
LAB_002fe83c:
      if ((((pRVar11 == (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) ||
           (pRVar11->fData == (KVStringPair *)0x0)) &&
          (pKVar12 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                               (facets,&SchemaSymbols::fgELT_TOTALDIGITS),
          pKVar12 == (KVStringPair *)0x0)) &&
         (((((this_01->super_AbstractStringValidator).super_DatatypeValidator.fBounded == false &&
            (VVar4 = (this_01->super_AbstractStringValidator).super_DatatypeValidator.fType,
            4 < VVar4 - MonthDay)) && (VVar4 != Date)) ||
          (pKVar12 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                               (facets,&SchemaSymbols::fgELT_FRACTIONDIGITS),
          pKVar12 == (KVStringPair *)0x0)))) goto LAB_002fe894;
    }
  }
  (this_01->super_AbstractStringValidator).super_DatatypeValidator.fFinite = true;
LAB_002fe8fa:
  if (isUserDefined) {
    ppRVar19 = &this->fUserDefinedRegistry;
    if (this->fUserDefinedRegistry ==
        (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0) {
      pRVar13 = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)
                XMemory::operator_new(0x38,userManager);
      pRVar13->fMemoryManager = userManager;
      pRVar13->fAdoptedElems = true;
      pRVar13->fBucketList = (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> **)0x0;
      pRVar13->fHashModulus = 0x1d;
      pRVar13->fInitialModulus = 0x1d;
      pRVar13->fCount = 0;
      iVar8 = (*userManager->_vptr_MemoryManager[3])(userManager,0xe8);
      pRVar13->fBucketList =
           (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> **)
           CONCAT44(extraout_var_00,iVar8);
      XVar7 = pRVar13->fHashModulus;
      if (XVar7 != 0) {
        XVar14 = 0;
        do {
          pRVar13->fBucketList[XVar14] =
               (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0;
          XVar14 = XVar14 + 1;
        } while (XVar7 != XVar14);
      }
      *ppRVar19 = pRVar13;
    }
  }
  else {
    ppRVar19 = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> **)
               &fBuiltInRegistry;
  }
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (*ppRVar19,typeName,(DatatypeValidator *)this_01);
  DatatypeValidator::setTypeName((DatatypeValidator *)this_01,typeName);
  return (DatatypeValidator *)this_01;
}

Assistant:

DatatypeValidator* DatatypeValidatorFactory::createDatatypeValidator
(
      const XMLCh* const                  typeName
	, DatatypeValidator* const            baseValidator
    , RefHashTableOf<KVStringPair>* const facets
    , RefArrayVectorOf<XMLCh>* const      enums
    , const bool                          isDerivedByList
    , const int                           finalSet
    , const bool                          isUserDefined
    , MemoryManager* const                userManager
)
{
	if (baseValidator == 0) {

        if (facets) {
            Janitor<KVStringPairHashTable> janFacets(facets);
        }

        if (enums) {
            Janitor<XMLChRefVector> janEnums(enums);
        }

        return 0;
    }

	DatatypeValidator* datatypeValidator = 0;
    MemoryManager* const manager = (isUserDefined)
        ? userManager : XMLPlatformUtils::fgMemoryManager;

    if (isDerivedByList) {
        datatypeValidator = new (manager) ListDatatypeValidator(baseValidator, facets, enums, finalSet, manager);

        // Set PSVI information for Ordered, Numeric, Bounded & Finite
        datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_FALSE);
        datatypeValidator->setNumeric(false);
        if (facets &&
             ((facets->get(SchemaSymbols::fgELT_LENGTH) ||
              (facets->get(SchemaSymbols::fgELT_MINLENGTH) && facets->get(SchemaSymbols::fgELT_MAXLENGTH)))))
        {
            datatypeValidator->setBounded(true);
            datatypeValidator->setFinite(true);
        }
        else
        {
            datatypeValidator->setBounded(false);
            datatypeValidator->setFinite(false);
        }
    }
    else {

        if ((baseValidator->getType() != DatatypeValidator::String) && facets) {

            KVStringPair* value = facets->get(SchemaSymbols::fgELT_WHITESPACE);

            if (value != 0) {
                facets->removeKey(SchemaSymbols::fgELT_WHITESPACE);
            }
        }

        datatypeValidator = baseValidator->newInstance
        (
            facets
            , enums
            , finalSet
            , manager
        );

        // Set PSVI information for Ordered, Numeric, Bounded & Finite
        datatypeValidator->setOrdered(baseValidator->getOrdered());
        datatypeValidator->setNumeric(baseValidator->getNumeric());
        RefHashTableOf<KVStringPair>* baseFacets = baseValidator->getFacets();
        if (facets  &&
            ((facets->get(SchemaSymbols::fgELT_MININCLUSIVE) ||
              facets->get(SchemaSymbols::fgELT_MINEXCLUSIVE) ||
              (baseFacets && (baseFacets->get(SchemaSymbols::fgELT_MININCLUSIVE) ||
                              baseFacets->get(SchemaSymbols::fgELT_MINEXCLUSIVE))))) &&
             (facets->get(SchemaSymbols::fgELT_MAXINCLUSIVE) ||
              facets->get(SchemaSymbols::fgELT_MAXEXCLUSIVE) ||
              (baseFacets && ((baseFacets->get(SchemaSymbols::fgELT_MAXINCLUSIVE) ||
                               baseFacets->get(SchemaSymbols::fgELT_MAXEXCLUSIVE))))))
        {
            datatypeValidator->setBounded(true);
        }
        else
        {
            datatypeValidator->setBounded(false);
        }
        if (baseValidator->getFinite())
        {
            datatypeValidator->setFinite(true);
        }
        else if (!facets)
        {
            datatypeValidator->setFinite(false);
        }
        else if (facets->get(SchemaSymbols::fgELT_LENGTH) || facets->get(SchemaSymbols::fgELT_MAXLENGTH) ||
                 facets->get(SchemaSymbols::fgELT_TOTALDIGITS))
        {
            datatypeValidator->setFinite(true);
        }
        //for efficiency use this instead of rechecking...
        //else if ((facets->get(SchemaSymbols::fgELT_MININCLUSIVE) || facets->get(SchemaSymbols::fgELT_MINEXCLUSIVE)) &&
        //         (facets->get(SchemaSymbols::fgELT_MAXINCLUSIVE) || facets->get(SchemaSymbols::fgELT_MAXEXCLUSIVE)))
        else if (datatypeValidator->getBounded() ||
                 datatypeValidator->getType() == DatatypeValidator::Date      ||
                 datatypeValidator->getType() == DatatypeValidator::YearMonth ||
                 datatypeValidator->getType() == DatatypeValidator::Year      ||
                 datatypeValidator->getType() == DatatypeValidator::MonthDay  ||
                 datatypeValidator->getType() == DatatypeValidator::Day       ||
                 datatypeValidator->getType() == DatatypeValidator::Month)
        {
            if (facets->get(SchemaSymbols::fgELT_FRACTIONDIGITS))
            {
                datatypeValidator->setFinite(true);
            }
            else
            {
                datatypeValidator->setFinite(false);
            }
        }
        else
        {
            datatypeValidator->setFinite(false);
        }
    }

    if (datatypeValidator != 0) {

        if (isUserDefined) {

            if (!fUserDefinedRegistry) {
                fUserDefinedRegistry = new (userManager) RefHashTableOf<DatatypeValidator>(29, userManager);
            }

            fUserDefinedRegistry->put((void *)typeName, datatypeValidator);
        }
        else {
            fBuiltInRegistry->put((void *)typeName, datatypeValidator);
        }

        datatypeValidator->setTypeName(typeName);
    }

    return datatypeValidator;
}